

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtDec.c
# Opt level: O0

Dec_Edge_t Rwt_TravCollect_rec(Rwt_Man_t *p,Rwt_Node_t *pNode,Dec_Graph_t *pGraph)

{
  int iVar1;
  uint uVar2;
  Rwt_Node_t *pRVar3;
  Dec_Edge_t local_34;
  Dec_Edge_t local_30;
  Dec_Edge_t eNode;
  Dec_Edge_t eNode1;
  Dec_Edge_t eNode0;
  Dec_Graph_t *pGraph_local;
  Rwt_Node_t *pNode_local;
  Rwt_Man_t *p_local;
  
  if ((*(uint *)&pNode->field_0x8 >> 0x1e & 1) == 0) {
    if (pNode->TravId == p->nTravIds) {
      p_local._4_4_ = Dec_IntToEdge(*(uint *)&pNode->field_0x8 >> 0x10 & 0xff);
    }
    else {
      pNode->TravId = p->nTravIds;
      pRVar3 = Rwt_Regular(pNode->p0);
      eNode = Rwt_TravCollect_rec(p,pRVar3,pGraph);
      iVar1 = Rwt_IsComplement(pNode->p0);
      if (iVar1 != 0) {
        eNode = (Dec_Edge_t)((uint)eNode & 0xfffffffe | (uint)(((uint)eNode & 1) == 0));
      }
      pRVar3 = Rwt_Regular(pNode->p1);
      local_30 = Rwt_TravCollect_rec(p,pRVar3,pGraph);
      iVar1 = Rwt_IsComplement(pNode->p1);
      if (iVar1 != 0) {
        local_30 = (Dec_Edge_t)((uint)local_30 & 0xfffffffe | (uint)(((uint)local_30 & 1) == 0));
      }
      if (*(int *)&pNode->field_0x8 < 0) {
        local_34 = Dec_GraphAddNodeXor(pGraph,eNode,local_30,0);
      }
      else {
        local_34 = Dec_GraphAddNodeAnd(pGraph,eNode,local_30);
      }
      uVar2 = Dec_EdgeToInt(local_34);
      *(uint *)&pNode->field_0x8 = *(uint *)&pNode->field_0x8 & 0xff00ffff | (uVar2 & 0xff) << 0x10;
      p_local._4_4_ = local_34;
    }
  }
  else {
    p_local._4_4_ = Dec_EdgeCreate(pNode->Id + -1,0);
  }
  return p_local._4_4_;
}

Assistant:

Dec_Edge_t Rwt_TravCollect_rec( Rwt_Man_t * p, Rwt_Node_t * pNode, Dec_Graph_t * pGraph )
{
    Dec_Edge_t eNode0, eNode1, eNode;
    // elementary variable
    if ( pNode->fUsed )
        return Dec_EdgeCreate( pNode->Id - 1, 0 );
    // previously visited node
    if ( pNode->TravId == p->nTravIds )
        return Dec_IntToEdge( pNode->Volume );
    pNode->TravId = p->nTravIds;
    // solve for children
    eNode0 = Rwt_TravCollect_rec( p, Rwt_Regular(pNode->p0), pGraph );
    if ( Rwt_IsComplement(pNode->p0) )    
        eNode0.fCompl = !eNode0.fCompl;
    eNode1 = Rwt_TravCollect_rec( p, Rwt_Regular(pNode->p1), pGraph );
    if ( Rwt_IsComplement(pNode->p1) )    
        eNode1.fCompl = !eNode1.fCompl;
    // create the decomposition node(s)
    if ( pNode->fExor )
        eNode = Dec_GraphAddNodeXor( pGraph, eNode0, eNode1, 0 );
    else
        eNode = Dec_GraphAddNodeAnd( pGraph, eNode0, eNode1 );
    // save the result
    pNode->Volume = Dec_EdgeToInt( eNode );
    return eNode;
}